

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableBlockVector.hpp
# Opt level: O1

iterator * __thiscall
gmlc::containers::StableBlockVector<helics::Endpoint,_5U,_std::allocator<helics::Endpoint>_>::end
          (iterator *__return_storage_ptr__,
          StableBlockVector<helics::Endpoint,_5U,_std::allocator<helics::Endpoint>_> *this)

{
  int iVar1;
  int iVar2;
  Endpoint **ppEVar3;
  
  iVar2 = this->bsize;
  ppEVar3 = this->dataptr;
  if ((long)iVar2 == 0x20) {
    if (ppEVar3 == (Endpoint **)0x0) {
      ppEVar3 = &end::emptyValue;
    }
    else {
      ppEVar3 = ppEVar3 + (long)this->dataSlotIndex + 1;
    }
    __return_storage_ptr__->vec = ppEVar3;
    __return_storage_ptr__->ptr = *ppEVar3;
    iVar2 = 0;
  }
  else {
    iVar1 = this->dataSlotIndex;
    __return_storage_ptr__->vec = ppEVar3 + iVar1;
    __return_storage_ptr__->ptr = ppEVar3[iVar1] + iVar2;
  }
  __return_storage_ptr__->offset = iVar2;
  return __return_storage_ptr__;
}

Assistant:

iterator end()
        {
            static X* emptyValue{nullptr};
            if (bsize == blockSize) {
                X** ptr = (dataptr != nullptr) ? &(dataptr[dataSlotIndex + 1]) :
                                                 &emptyValue;
                return {ptr, 0};
            }
            X** ptr = &(dataptr[dataSlotIndex]);
            return {ptr, bsize};
        }